

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall ClipperLib::ClipperBase::PopScanbeam(ClipperBase *this,cInt *Y)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  const_reference pvVar4;
  cInt *Y_local;
  ClipperBase *this_local;
  
  bVar2 = std::
          priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
          ::empty(&this->m_Scanbeam);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    pvVar4 = std::
             priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
             ::top(&this->m_Scanbeam);
    *Y = *pvVar4;
    std::
    priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
    ::pop(&this->m_Scanbeam);
    while( true ) {
      bVar3 = std::
              priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
              ::empty(&this->m_Scanbeam);
      bVar2 = false;
      if (!bVar3) {
        lVar1 = *Y;
        pvVar4 = std::
                 priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
                 ::top(&this->m_Scanbeam);
        bVar2 = lVar1 == *pvVar4;
      }
      if (!bVar2) break;
      std::
      priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
      ::pop(&this->m_Scanbeam);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ClipperBase::PopScanbeam(cInt &Y)
{
  if (m_Scanbeam.empty()) return false;
  Y = m_Scanbeam.top();
  m_Scanbeam.pop();
  while (!m_Scanbeam.empty() && Y == m_Scanbeam.top()) { m_Scanbeam.pop(); } // Pop duplicates.
  return true;
}